

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
solitaire::colliders::TableauPileCollider::tryGetCollidedCardIndex
          (TableauPileCollider *this,Position *position)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  int extraout_var_01;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
  if ((*(long *)CONCAT44(extraout_var,iVar1) == ((long *)CONCAT44(extraout_var,iVar1))[1]) ||
     (iVar1 = (this->position).x, iVar1 + 0x4b <= position->x || position->x < iVar1)) {
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    iVar1 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
    uVar3 = (uint)((ulong)(((long *)CONCAT44(extraout_var_00,iVar1))[1] -
                          *(long *)CONCAT44(extraout_var_00,iVar1)) >> 3);
    uVar4 = 0x100000000;
    do {
      uVar3 = uVar3 - 1;
      uVar2 = (ulong)uVar3;
      if ((int)uVar3 < 0) {
        uVar4 = 0;
        break;
      }
      (*(this->super_TableauPileCollider)._vptr_TableauPileCollider[4])(this,uVar2);
    } while (extraout_var_01 + 0x68 <= position->y || position->y < extraout_var_01);
  }
  return (optional<unsigned_int>)(uVar2 | uVar4);
}

Assistant:

std::optional<unsigned>
TableauPileCollider::tryGetCollidedCardIndex(const Position& position) const {
    if (isEmptyOrNotCollidesWithPileXPosition(position))
        return std::nullopt;

    for (int cardIndex = tableauPile.getCards().size() - 1; cardIndex >= 0; --cardIndex)
        if (collidesWithCardYPosition(position, cardIndex))
            return cardIndex;

    return std::nullopt;
}